

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O1

void SHEvaluate(vec3f *w,int lmax,float *out)

{
  vec3f *pvVar1;
  void *__s;
  int iVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  float *pfVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined8 uStack_70;
  ulong local_68;
  vec3f *local_60;
  long local_58;
  ulong local_50;
  void *local_48;
  float *local_40;
  float local_34;
  
  local_40 = out;
  if (0x1c < lmax) {
    uStack_70 = 0x1805ec;
    __assert_fail("lmax <= 28",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                  ,0x84,"void SHEvaluate(const vec3f &, int, float *)");
  }
  fVar19 = w->z * w->z + w->x * w->x + w->y * w->y;
  if (fVar19 < 0.0) {
    uStack_70 = 0x17fd8c;
    fVar19 = sqrtf(fVar19);
  }
  else {
    fVar19 = SQRT(fVar19);
  }
  if (0.995 < fVar19) {
    fVar19 = w->z * w->z + w->x * w->x + w->y * w->y;
    if (fVar19 < 0.0) {
      uStack_70 = 0x17fdd1;
      fVar19 = sqrtf(fVar19);
    }
    else {
      fVar19 = SQRT(fVar19);
    }
    if (fVar19 < 1.005) {
      fVar19 = w->z;
      *local_40 = 1.0;
      local_40[2] = fVar19;
      iVar2 = 3;
      iVar3 = 0;
      do {
        iVar8 = iVar3 + 2;
        if (lmax < iVar8) {
          fVar20 = 1.0 - fVar19 * fVar19;
          if (fVar20 <= 0.0) {
            fVar20 = 0.0;
          }
          if (fVar20 < 0.0) {
            uStack_70 = 0x17fee6;
            local_34 = fVar19;
            fVar20 = sqrtf(fVar20);
            fVar19 = local_34;
          }
          else {
            fVar20 = SQRT(fVar20);
          }
          fVar24 = 1.0;
          if (0 < lmax) {
            fVar21 = -1.0;
            iVar3 = 1;
            iVar2 = 3;
            fVar22 = fVar20;
            do {
              fVar23 = fVar24 * fVar21 * fVar22;
              local_40[(iVar3 + 2) * iVar3] = fVar23;
              if (NAN(fVar23)) {
                uStack_70 = 0x18058f;
                __assert_fail("!isnan(P(l, l))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                              ,0x59,"void legendrep(float, int, float *)");
              }
              if (ABS(fVar23) == INFINITY) {
                uStack_70 = 0x1805ae;
                __assert_fail("!isinf(P(l, l))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                              ,0x5a,"void legendrep(float, int, float *)");
              }
              iVar3 = iVar3 + 1;
              fVar21 = -fVar21;
              fVar24 = fVar24 * (float)iVar2;
              fVar22 = fVar22 * fVar20;
              iVar2 = iVar2 + 2;
            } while (iVar3 <= lmax);
          }
          iVar3 = 3;
          iVar2 = 3;
          do {
            if (lmax < iVar3 + -1) {
              local_60 = w;
              local_50 = (ulong)(uint)lmax;
              if (2 < lmax) {
                iVar3 = 2;
                lVar10 = 0;
                uVar13 = 3;
                do {
                  uVar16 = uVar13 + 1;
                  lVar12 = uVar13 << 0x20;
                  lVar18 = -1;
                  iVar2 = iVar3;
                  do {
                    fVar20 = (*(float *)((long)local_40 +
                                        lVar18 * 4 +
                                        ((long)(lVar12 * (uVar13 + 0xffffffff)) >> 0x1e) + 8) *
                              (float)((int)uVar13 * 2 + -1) * fVar19 -
                             (float)((int)uVar13 + (int)lVar18 + 1) *
                             *(float *)((long)local_40 +
                                       lVar18 * 4 +
                                       ((long)((lVar12 + -0x200000000) * (uVar13 + 0xffffffff)) >>
                                       0x1e) + 8)) / (float)iVar2;
                    *(float *)((long)local_40 + lVar18 * 4 + ((long)(lVar12 * uVar16) >> 0x1e) + 8)
                         = fVar20;
                    if (NAN(fVar20)) {
                      uStack_70 = 0x1804b6;
                      __assert_fail("!isnan(P(l, m))",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                    ,0x6e,"void legendrep(float, int, float *)");
                    }
                    if (ABS(fVar20) == INFINITY) {
                      uStack_70 = 0x180497;
                      __assert_fail("!isinf(P(l, m))",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                    ,0x6f,"void legendrep(float, int, float *)");
                    }
                    lVar18 = lVar18 + 1;
                    iVar2 = iVar2 + -1;
                  } while (lVar10 + lVar18 != 0);
                  lVar10 = lVar10 + -1;
                  iVar3 = iVar3 + 1;
                  uVar13 = uVar16;
                } while (uVar16 != lmax + 1);
              }
              uVar14 = lmax + 1;
              lVar10 = -((ulong)(uVar14 * uVar14) * 4 + 0xf & 0x3fffffff0);
              lVar12 = (long)&local_68 + lVar10;
              local_58 = lVar12;
              uVar13 = (ulong)uVar14;
              if (-1 < lmax) {
                iVar3 = 1;
                uVar16 = 0;
                lVar18 = 0;
                local_68 = (ulong)uVar14;
                do {
                  iVar2 = (int)uVar16;
                  local_34 = (float)iVar2;
                  fVar19 = (local_34 + local_34 + 1.0) * 0.07957747;
                  lVar7 = local_58 + (long)((iVar2 + 1) * iVar2) * 4;
                  local_48 = (void *)CONCAT44(local_48._4_4_,fVar19);
                  lVar15 = lVar18;
                  do {
                    fVar20 = 1.0;
                    if (lVar15 != 0) {
                      fVar24 = ABS((float)(int)lVar15) + local_34;
                      fVar22 = (local_34 - ABS((float)(int)lVar15)) + 1.0;
                      fVar20 = 1.0;
                      if (fVar22 <= fVar24) {
                        fVar20 = 1.0;
                        do {
                          fVar20 = fVar20 * fVar22;
                          fVar22 = fVar22 + 1.0;
                        } while (fVar22 <= fVar24);
                      }
                      fVar20 = 1.0 / fVar20;
                    }
                    fVar20 = fVar20 * fVar19;
                    if (fVar20 < 0.0) {
                      *(undefined8 *)((long)&uStack_70 + lVar10) = 0x1801da;
                      fVar20 = sqrtf(fVar20);
                      fVar19 = local_48._0_4_;
                    }
                    else {
                      fVar20 = SQRT(fVar20);
                    }
                    *(float *)(lVar7 + lVar15 * 4) = fVar20;
                    lVar15 = lVar15 + 1;
                  } while (iVar3 != (int)lVar15);
                  uVar16 = uVar16 + 1;
                  lVar18 = lVar18 + -1;
                  iVar3 = iVar3 + 1;
                  uVar13 = local_68;
                } while (uVar16 != local_68);
              }
              pvVar1 = local_60;
              uVar16 = (uVar13 & 0xffffffff) * 4 + 0xf & 0xfffffffffffffff0;
              pvVar5 = (void *)(lVar12 - uVar16);
              local_48 = pvVar5;
              fVar19 = 1.0 - local_60->z * local_60->z;
              if (fVar19 <= 0.0) {
                fVar19 = 0.0;
              }
              if (fVar19 < 0.0) {
                *(undefined8 *)((long)pvVar5 + (-8 - uVar16)) = 0x180275;
                fVar19 = sqrtf(fVar19);
              }
              else {
                fVar19 = SQRT(fVar19);
              }
              __s = local_48;
              fVar20 = 1.0;
              iVar3 = (int)local_50;
              if ((fVar19 != 0.0) || (NAN(fVar19))) {
                if (-1 < iVar3) {
                  fVar22 = pvVar1->y / fVar19;
                  fVar19 = pvVar1->x / fVar19;
                  fVar24 = 0.0;
                  lVar10 = 0;
                  do {
                    *(float *)((long)__s + lVar10 * 4) = fVar24;
                    *(float *)((long)pvVar5 + (lVar10 * 4 - uVar16)) = fVar20;
                    fVar21 = fVar22 * fVar24;
                    fVar24 = fVar24 * fVar19 + fVar22 * fVar20;
                    fVar20 = fVar20 * fVar19 - fVar21;
                    lVar10 = lVar10 + 1;
                  } while ((int)uVar13 != (int)lVar10);
                }
              }
              else if (-1 < iVar3) {
                uVar4 = local_50 & 0xffffffff;
                *(undefined8 *)((long)pvVar5 + (-8 - uVar16)) = 0x1802a4;
                memset(__s,0,uVar4 * 4 + 4);
                uVar4 = 0;
                do {
                  *(undefined4 *)((long)pvVar5 + (uVar4 * 4 - uVar16)) = 0x3f800000;
                  uVar4 = uVar4 + 1;
                } while (uVar13 != uVar4);
              }
              if (SHEvaluate(vec3f_const&,int,float*)::sqrt2 == '\0') {
                *(undefined8 *)((long)pvVar5 + (-8 - uVar16)) = 0x1805f1;
                SHEvaluate();
              }
              fVar19 = SHEvaluate::sqrt2;
              if (-1 < iVar3) {
                uVar14 = 1;
                iVar2 = 2;
                iVar8 = 3;
                iVar9 = 0;
                local_34 = 0.0;
                iVar11 = 0;
                iVar3 = 0;
                do {
                  lVar12 = (long)iVar9;
                  lVar10 = local_58 + lVar12 * 4;
                  if (0 < iVar3) {
                    pfVar17 = (float *)((long)local_48 + (long)iVar11 * -4);
                    fVar20 = local_34;
                    lVar18 = (long)iVar11;
                    do {
                      lVar7 = lVar18 + 1;
                      fVar24 = *(float *)(lVar10 + -4 + lVar7 * 4) * fVar19 * local_40[(int)fVar20]
                               * *pfVar17;
                      local_40[lVar12 + lVar18] = fVar24;
                      if (NAN(fVar24)) {
                        *(undefined8 *)((long)pvVar5 + (-8 - uVar16)) = 0x1804f4;
                        __assert_fail("!isnan(out[SHIndex(l,m)])",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                      ,0xa6,"void SHEvaluate(const vec3f &, int, float *)");
                      }
                      if (ABS(fVar24) == INFINITY) {
                        *(undefined8 *)((long)pvVar5 + (-8 - uVar16)) = 0x1804d5;
                        __assert_fail("!isinf(out[SHIndex(l,m)])",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                      ,0xa7,"void SHEvaluate(const vec3f &, int, float *)");
                      }
                      pfVar17 = pfVar17 + -1;
                      fVar20 = (float)((int)fVar20 + -1);
                      lVar18 = lVar7;
                    } while ((int)lVar7 != 0);
                  }
                  iVar6 = iVar3 + 1;
                  lVar18 = (long)(iVar6 * iVar3);
                  local_40[lVar18] = *(float *)(local_58 + lVar18 * 4) * local_40[lVar18];
                  if (iVar3 != 0) {
                    uVar13 = 1;
                    do {
                      fVar20 = *(float *)(lVar10 + uVar13 * 4) * fVar19 *
                               *(float *)((long)pvVar5 + (uVar13 * 4 - uVar16)) *
                               local_40[lVar12 + uVar13];
                      local_40[lVar12 + uVar13] = fVar20;
                      if (NAN(fVar20)) {
                        *(undefined8 *)((long)pvVar5 + (-8 - uVar16)) = 0x180532;
                        __assert_fail("!isnan(out[SHIndex(l,m)])",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                      ,0xad,"void SHEvaluate(const vec3f &, int, float *)");
                      }
                      if (ABS(fVar20) == INFINITY) {
                        *(undefined8 *)((long)pvVar5 + (-8 - uVar16)) = 0x180513;
                        __assert_fail("!isinf(out[SHIndex(l,m)])",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                      ,0xae,"void SHEvaluate(const vec3f &, int, float *)");
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar14 != uVar13);
                  }
                  iVar11 = iVar11 + -1;
                  uVar14 = uVar14 + 1;
                  iVar9 = iVar9 + iVar2;
                  iVar2 = iVar2 + 2;
                  local_34 = (float)((int)local_34 + iVar8);
                  iVar8 = iVar8 + 2;
                  iVar3 = iVar6;
                } while (iVar6 <= (int)local_50);
              }
              return;
            }
            fVar20 = (float)iVar2 * fVar19 * local_40[(iVar3 + -2) * iVar3];
            local_40[(iVar3 + -1) * iVar3 + iVar3 + -2] = fVar20;
            if (NAN(fVar20)) {
              uStack_70 = 0x180570;
              __assert_fail("!isnan(P(l, l-1))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                            ,100,"void legendrep(float, int, float *)");
            }
            iVar2 = iVar2 + 2;
            iVar3 = iVar3 + 1;
          } while (ABS(fVar20) != INFINITY);
          uStack_70 = 0x17ffe7;
          __assert_fail("!isinf(P(l, l-1))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                        ,0x65,"void legendrep(float, int, float *)");
        }
        iVar9 = iVar3 + 1;
        fVar20 = ((float)iVar2 * fVar19 * local_40[iVar9 * iVar8] -
                 (float)(iVar3 + 1) * local_40[iVar9 * iVar3]) / (float)iVar8;
        local_40[(iVar3 + 3) * iVar8] = fVar20;
        if (NAN(fVar20)) {
          uStack_70 = 0x180551;
          __assert_fail("!isnan(P(l, 0))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                        ,0x4e,"void legendrep(float, int, float *)");
        }
        iVar2 = iVar2 + 2;
        iVar3 = iVar9;
      } while (ABS(fVar20) != INFINITY);
      uStack_70 = 0x17fea6;
      __assert_fail("!isinf(P(l, 0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                    ,0x4f,"void legendrep(float, int, float *)");
    }
  }
  uStack_70 = 0x1805cd;
  __assert_fail("norm(w) > .995f && norm(w) < 1.005f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                ,0x8c,"void SHEvaluate(const vec3f &, int, float *)");
}

Assistant:

void SHEvaluate(const vec3f &w, int lmax, float *out) {
    assert(lmax <= 28);
    // if (lmax > 28) {
    //     console.error("SHEvaluate() runs out of numerical precision for lmax > 28. "
    //            "If you need more bands, try recompiling using doubles.");
    //     exit(1);
    // }

    // Compute Legendre polynomial values for $\cos\theta$
    assert(norm(w) > .995f && norm(w) < 1.005f);
    legendrep(w.z, lmax, out);

    // Compute $K_l^m$ coefficients
    float Klm[SHTerms(lmax)];
    for (int l = 0; l <= lmax; ++l)
        for (int m = -l; m <= l; ++m)
            Klm[SHIndex(l, m)] = K(l, m);

    // Compute $\sin\phi$ and $\cos\phi$ values
    float sins[lmax+1], coss[lmax+1];
    float xyLen = sqrtf(fmax(0.f, 1.f - w.z*w.z));
    if (xyLen == 0.f) {
        for (int i = 0; i <= lmax; ++i) sins[i] = 0.f;
        for (int i = 0; i <= lmax; ++i) coss[i] = 1.f;
    }
    else
        sinCosIndexed(w.y / xyLen, w.x / xyLen, lmax+1, sins, coss);

    // Apply SH definitions to compute final $(l,m)$ values
    static const float sqrt2 = sqrtf(2.f);
    for (int l = 0; l <= lmax; ++l) {
        for (int m = -l; m < 0; ++m)
        {
            out[SHIndex(l, m)] = sqrt2 * Klm[SHIndex(l, m)] *
                out[SHIndex(l, -m)] * sins[-m];
            assert(!isnan(out[SHIndex(l,m)]));
            assert(!isinf(out[SHIndex(l,m)]));
        }
        out[SHIndex(l, 0)] *= Klm[SHIndex(l, 0)];
        for (int m = 1; m <= l; ++m)
        {
            out[SHIndex(l, m)] *= sqrt2 * Klm[SHIndex(l, m)] * coss[m];
            assert(!isnan(out[SHIndex(l,m)]));
            assert(!isinf(out[SHIndex(l,m)]));
        }
    }
}